

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Point3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f *p,Float time)

{
  float fVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Point3f PVar9;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    fVar7 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->startTransform).m.m[3][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->startTransform).m.m[3][0]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->startTransform).m.m[0][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->startTransform).m.m[0][0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->startTransform).m.m[1][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->startTransform).m.m[1][0]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->startTransform).m.m[2][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->startTransform).m.m[2][0]));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->startTransform).m.m[3][2]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->startTransform).m.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->startTransform).m.m[1][2]));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->startTransform).m.m[2][2]));
    fVar6 = auVar5._0_4_ + (this->startTransform).m.m[3][3];
    auVar5 = ZEXT416((uint)(auVar8._0_4_ + (this->startTransform).m.m[0][3]));
    auVar8 = ZEXT416((uint)(auVar4._0_4_ + (this->startTransform).m.m[1][3]));
    fVar7 = auVar3._0_4_ + (this->startTransform).m.m[2][3];
  }
  else if (this->endTime <= time) {
    fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    fVar7 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->endTransform).m.m[3][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->endTransform).m.m[0][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).m.m[0][0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->endTransform).m.m[1][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).m.m[1][0]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (this->endTransform).m.m[2][1])),
                             ZEXT416((uint)fVar7),ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->endTransform).m.m[3][2]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar1),
                             ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar6 = auVar5._0_4_ + (this->endTransform).m.m[3][3];
    auVar5 = ZEXT416((uint)(auVar8._0_4_ + (this->endTransform).m.m[0][3]));
    auVar8 = ZEXT416((uint)(auVar4._0_4_ + (this->endTransform).m.m[1][3]));
    fVar7 = auVar3._0_4_ + (this->endTransform).m.m[2][3];
  }
  else {
    Interpolate(&local_90,this,time);
    fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    fVar7 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_90.m.m[3][1])),ZEXT416((uint)fVar7),
                             ZEXT416((uint)local_90.m.m[3][0]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_90.m.m[0][1])),ZEXT416((uint)fVar7),
                             ZEXT416((uint)local_90.m.m[0][0]));
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_90.m.m[1][1])),ZEXT416((uint)fVar7),
                             ZEXT416((uint)local_90.m.m[1][0]));
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_90.m.m[2][1])),ZEXT416((uint)fVar7),
                             ZEXT416((uint)local_90.m.m[2][0]));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[3][2]));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[0][2]));
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[1][2]));
    auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[2][2]));
    fVar6 = auVar5._0_4_ + local_90.m.m[3][3];
    auVar5 = ZEXT416((uint)(auVar8._0_4_ + local_90.m.m[0][3]));
    auVar8 = ZEXT416((uint)(auVar4._0_4_ + local_90.m.m[1][3]));
    fVar7 = auVar3._0_4_ + local_90.m.m[2][3];
  }
  bVar2 = fVar6 == 1.0;
  auVar4._0_4_ = (uint)bVar2 * (int)auVar5._0_4_ + (uint)!bVar2 * (int)(auVar5._0_4_ / fVar6);
  auVar4._4_12_ = auVar5._4_12_;
  auVar5._0_4_ = (uint)bVar2 * (int)auVar8._0_4_ + (uint)!bVar2 * (int)(auVar8._0_4_ / fVar6);
  auVar5._4_12_ = auVar8._4_12_;
  auVar5 = vinsertps_avx(auVar4,auVar5,0x10);
  PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar5._0_8_;
  PVar9.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar2 * (int)fVar7 + (uint)!bVar2 * (int)(fVar7 / fVar6));
  return (Point3f)PVar9.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f AnimatedTransform::operator()(const Point3f &p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}